

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FieldDescriptor::FieldTypeNameDebugString_abi_cxx11_(FieldDescriptor *this)

{
  Type TVar1;
  Descriptor *this_00;
  EnumDescriptor *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  FieldDescriptor *in_stack_ffffffffffffffb0;
  char *pcVar2;
  string *this_02;
  allocator local_11;
  string *__lhs;
  
  this_02 = in_RDI;
  __lhs = in_RDI;
  TVar1 = type((FieldDescriptor *)in_RDI);
  if (TVar1 == TYPE_MESSAGE) {
    this_00 = message_type(in_stack_ffffffffffffffb0);
    Descriptor::full_name_abi_cxx11_(this_00);
    std::operator+((char *)__lhs,in_RSI);
  }
  else if (TVar1 == TYPE_ENUM) {
    this_01 = enum_type(in_stack_ffffffffffffffb0);
    EnumDescriptor::full_name_abi_cxx11_(this_01);
    std::operator+((char *)__lhs,in_RSI);
  }
  else {
    TVar1 = type((FieldDescriptor *)this_02);
    pcVar2 = *(char **)(kTypeToName + (ulong)TVar1 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this_02,pcVar2,&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  return in_RDI;
}

Assistant:

std::string FieldDescriptor::FieldTypeNameDebugString() const {
  switch (type()) {
    case TYPE_MESSAGE:
      return "." + message_type()->full_name();
    case TYPE_ENUM:
      return "." + enum_type()->full_name();
    default:
      return kTypeToName[type()];
  }
}